

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::EarlyFragmentTestsCase::iterate
          (EarlyFragmentTestsCase *this)

{
  ostringstream *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  RenderTargetType RVar3;
  Functional *this_01;
  TestLog *log;
  deUint32 dVar4;
  GLenum GVar5;
  ContextType type;
  GLSLVersion version;
  Functions *pFVar6;
  int *piVar7;
  long lVar8;
  ObjectTraits *pOVar9;
  ObjectWrapper *pOVar10;
  undefined8 *puVar11;
  long *plVar12;
  TestError *this_02;
  RenderTargetType RVar13;
  int iVar14;
  ulong *puVar15;
  long *plVar16;
  Surface *surface;
  RenderContext *renderContext;
  char *pcVar17;
  void *__buf;
  int iVar18;
  char *pcVar19;
  undefined8 uVar20;
  ulong uVar21;
  void *data;
  bool bVar22;
  CallLogWrapper glLog;
  uint local_488;
  uint local_484;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Surface rendered;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  int local_438;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  testAttachment;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  colorAttachment;
  ulong *local_408;
  long local_400;
  ulong local_3f8 [2];
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  fbo;
  long *local_3d8;
  undefined8 local_3d0;
  long local_3c8;
  undefined8 uStack_3c0;
  long *local_3b8;
  undefined8 local_3b0;
  long local_3a8;
  undefined8 uStack_3a0;
  ulong *local_398;
  long local_390;
  ulong local_388;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  ulong *local_378;
  long local_370;
  ulong local_368 [2];
  string local_358;
  long *local_338;
  long local_330;
  long local_328;
  undefined4 uStack_320;
  undefined4 uStack_31c;
  Texture texture;
  string glslVersionDeclaration;
  UniformAccessLogger uniforms;
  Random rnd;
  VertexArrayBinding attrBindings [1];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [40];
  LayeredImage src;
  ios_base local_138 [32];
  deUint32 local_118;
  bool local_f0;
  
  this_01 = (Functional *)((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pFVar6 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
  glu::CallLogWrapper::CallLogWrapper(&glLog,pFVar6,log);
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&rnd.m_rnd,dVar4);
  RVar3 = this->m_renderTarget;
  bVar22 = this->m_useEarlyTests;
  local_488 = 0;
  local_484 = 0;
  if (RVar3 == RENDERTARGET_DEFAULT) {
    piVar7 = (int *)(**(code **)(*(long *)this_01 + 0x20))(this_01);
    iVar14 = *piVar7;
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    local_484 = dVar4 % (iVar14 - 0x1fU);
  }
  if (this->m_renderTarget == RENDERTARGET_DEFAULT) {
    lVar8 = (**(code **)(*(long *)this_01 + 0x20))(this_01);
    iVar14 = *(int *)(lVar8 + 4);
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    local_488 = dVar4 % (iVar14 - 0x1fU);
  }
  pFVar6 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))();
  pOVar9 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&texture.super_ObjectWrapper,pFVar6,pOVar9);
  fbo.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  colorAttachment.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)0x0;
  testAttachment.
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)0x0;
  glLog.m_enableLog = true;
  this_00 = (ostringstream *)(src.m_size.m_data + 1);
  src._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&src,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,0xde1,texture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glTexParameteri(&glLog,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(&glLog,0xde1,0x2800,0x2600);
  attrBindings[0].binding.type = TYPE_LOCATION;
  attrBindings[0].binding._4_4_ = 0x21;
  LayeredImage::LayeredImage(&src,TEXTURETYPE_2D,(TextureFormat *)attrBindings,1,1,1);
  attrBindings[0].binding.type = TYPE_LOCATION;
  attrBindings[0].binding._4_4_ = 0;
  attrBindings[0].binding.name._M_dataplus._M_p = (pointer)0x0;
  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
            ((LayeredImage *)&src,0,0,0,(Vector<int,_4> *)attrBindings);
  uploadTexture(&glLog,&src,0);
  LayeredImage::~LayeredImage(&src);
  glu::CallLogWrapper::glBindImageTexture
            (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\x01',0,0x88ba,0x8236);
  lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
  dVar4 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar4,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0xba3);
  if (this->m_renderTarget - RENDERTARGET_FBO < 2) {
    pOVar10 = (ObjectWrapper *)operator_new(0x18);
    pFVar6 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
    pOVar9 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar10,pFVar6,pOVar9);
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    if (&(fbo.
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar10) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      ::reset(&fbo.
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             );
      fbo.
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)pOVar10;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             *)&src);
    pOVar10 = (ObjectWrapper *)operator_new(0x18);
    pFVar6 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
    pOVar9 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar10,pFVar6,pOVar9);
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    if (&(colorAttachment.
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar10) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ::reset(&colorAttachment.
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             );
      colorAttachment.
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar10;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)&src);
    pOVar10 = (ObjectWrapper *)operator_new(0x18);
    pFVar6 = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
    pOVar9 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
    glu::ObjectWrapper::ObjectWrapper(pOVar10,pFVar6,pOVar9);
    src.m_type = TEXTURETYPE_2D;
    src.m_size.m_data[0] = 0;
    if (&(testAttachment.
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
          .m_data.ptr)->super_ObjectWrapper != pOVar10) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      ::reset(&testAttachment.
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             );
      testAttachment.
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
      .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)2> *)pOVar10;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
             *)&src);
    glu::CallLogWrapper::glBindRenderbuffer
              (&glLog,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x8058,0x20,0x20);
    lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"gen color attachment rb",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbaf);
    glu::CallLogWrapper::glBindFramebuffer
              (&glLog,0x8d40,
               ((fbo.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&glLog,0x8d40,0x8ce0,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"set fbo color attachment",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbb3);
    RVar13 = this->m_renderTarget ^ RENDERTARGET_FBO;
    if (RVar13 == RENDERTARGET_DEFAULT && this->m_type == TESTTYPE_DEPTH) {
      glu::CallLogWrapper::glBindRenderbuffer
                (&glLog,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x81a5,0x20,0x20);
      lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"gen depth attachment rb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbb9);
      glu::CallLogWrapper::glFramebufferRenderbuffer
                (&glLog,0x8d40,0x8d00,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      iVar14 = 0xbbc;
      pcVar19 = "set fbo depth attachment";
LAB_014b24b6:
      glu::checkError(dVar4,pcVar19,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,iVar14);
    }
    else if (RVar13 == RENDERTARGET_DEFAULT && this->m_type == TESTTYPE_STENCIL) {
      glu::CallLogWrapper::glBindRenderbuffer
                (&glLog,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      glu::CallLogWrapper::glRenderbufferStorage(&glLog,0x8d41,0x8d48,0x20,0x20);
      lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar4,"gen stencil attachment rb",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0xbc2);
      glu::CallLogWrapper::glFramebufferRenderbuffer
                (&glLog,0x8d40,0x8d20,0x8d41,
                 ((testAttachment.
                   super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   .m_data.ptr)->super_ObjectWrapper).m_object);
      lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
      dVar4 = (**(code **)(lVar8 + 0x800))();
      iVar14 = 0xbc5;
      pcVar19 = "set fbo stencil attachment";
      goto LAB_014b24b6;
    }
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (&glLog,0x8d40,0x8ce0,0x8d41,
               ((colorAttachment.
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"setup fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xbc9);
    GVar5 = glu::CallLogWrapper::glCheckFramebufferStatus(&glLog,0x8d40);
    if (GVar5 != 0x8cd5) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,(char *)0x0,
                 "glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                 ,0xbca);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  glu::CallLogWrapper::glClearColor(&glLog,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glClear(&glLog,0x4000);
  if (this->m_type == TESTTYPE_STENCIL) {
    glu::CallLogWrapper::glClearStencil(&glLog,0);
    glu::CallLogWrapper::glClear(&glLog,0x400);
    glu::CallLogWrapper::glScissor(&glLog,local_484,local_488,0x10,0x20);
    glu::CallLogWrapper::glEnable(&glLog,0xc11);
    glu::CallLogWrapper::glClearStencil(&glLog,1);
    glu::CallLogWrapper::glClear(&glLog,0x400);
    glu::CallLogWrapper::glDisable(&glLog,0xc11);
    glu::CallLogWrapper::glStencilFunc(&glLog,0x202,1,1);
    GVar5 = 0xb90;
    glu::CallLogWrapper::glStencilOp(&glLog,0x1e00,0x1e00,0x1e00);
LAB_014b263e:
    glu::CallLogWrapper::glEnable(&glLog,GVar5);
  }
  else if (this->m_type == TESTTYPE_DEPTH) {
    glu::CallLogWrapper::glClearDepthf(&glLog,0.5);
    GVar5 = 0xb71;
    glu::CallLogWrapper::glClear(&glLog,0x100);
    goto LAB_014b263e;
  }
  type.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this_01 + 0x10))(this_01);
  version = glu::getContextTypeGLSLVersion(type);
  pcVar19 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar19,(allocator<char> *)&src);
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  memset(attrBindings,0,0xac);
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&__str);
  uniforms.m_gl = (Functions *)((ulong)uniforms.m_gl._4_4_ << 0x20);
  uniforms.m_log = (TestLog *)&uniforms.m_uniformLocations;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&uniforms.m_log,__str._M_dataplus._M_p,
             __str._M_dataplus._M_p + __str._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&attrBindings[0].binding.type + ((ulong)uniforms.m_gl & 0xffffffff) * 6),
              (value_type *)&uniforms.m_log);
  local_408 = local_3f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_408,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&local_408);
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_358,this_01,renderContext);
  uVar21 = 0xf;
  if (local_408 != local_3f8) {
    uVar21 = local_3f8[0];
  }
  if (uVar21 < local_358._M_string_length + local_400) {
    uVar20 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      uVar20 = local_358.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar20 < local_358._M_string_length + local_400) goto LAB_014b27c9;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,(ulong)local_408);
  }
  else {
LAB_014b27c9:
    puVar11 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_358._M_dataplus._M_p);
  }
  local_3d8 = &local_3c8;
  plVar12 = puVar11 + 2;
  if ((long *)*puVar11 == plVar12) {
    local_3c8 = *plVar12;
    uStack_3c0 = puVar11[3];
  }
  else {
    local_3c8 = *plVar12;
    local_3d8 = (long *)*puVar11;
  }
  local_3d0 = puVar11[1];
  *puVar11 = plVar12;
  puVar11[1] = 0;
  *(undefined1 *)plVar12 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_3d8);
  puVar15 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar15) {
    local_388 = *puVar15;
    uStack_380 = (undefined4)plVar12[3];
    uStack_37c = *(undefined4 *)((long)plVar12 + 0x1c);
    local_398 = &local_388;
  }
  else {
    local_388 = *puVar15;
    local_398 = (ulong *)*plVar12;
  }
  local_390 = plVar12[1];
  *plVar12 = (long)puVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  pcVar19 = "";
  if (this->m_useEarlyTests != false) {
    pcVar19 = "layout (early_fragment_tests) in;\n\n";
  }
  pcVar17 = pcVar19 + 0x23;
  if (this->m_useEarlyTests == false) {
    pcVar17 = pcVar19;
  }
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,pcVar19,pcVar17);
  uVar21 = 0xf;
  if (local_398 != &local_388) {
    uVar21 = local_388;
  }
  if (uVar21 < (ulong)(local_370 + local_390)) {
    uVar21 = 0xf;
    if (local_378 != local_368) {
      uVar21 = local_368[0];
    }
    if ((ulong)(local_370 + local_390) <= uVar21) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,(ulong)local_398);
      goto LAB_014b2960;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_398,(ulong)local_378);
LAB_014b2960:
  local_3b8 = &local_3a8;
  plVar12 = puVar11 + 2;
  if ((long *)*puVar11 == plVar12) {
    local_3a8 = *plVar12;
    uStack_3a0 = puVar11[3];
  }
  else {
    local_3a8 = *plVar12;
    local_3b8 = (long *)*puVar11;
  }
  local_3b0 = puVar11[1];
  *puVar11 = plVar12;
  puVar11[1] = 0;
  *(undefined1 *)plVar12 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_3b8);
  plVar16 = plVar12 + 2;
  if ((long *)*plVar12 == plVar16) {
    local_328 = *plVar16;
    uStack_320 = (undefined4)plVar12[3];
    uStack_31c = *(undefined4 *)((long)plVar12 + 0x1c);
    local_338 = &local_328;
  }
  else {
    local_328 = *plVar16;
    local_338 = (long *)*plVar12;
  }
  local_330 = plVar12[1];
  *plVar12 = (long)plVar16;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  rendered.m_width = 1;
  rendered.m_pixels.m_ptr = &local_448;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rendered.m_pixels,local_338,local_330 + (long)local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&attrBindings[0].binding.type + (rendered._0_8_ & 0xffffffff) * 6),
              (value_type *)&rendered.m_pixels);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)&src,(RenderContext *)this_01,(ProgramSources *)attrBindings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rendered.m_pixels.m_ptr != &local_448) {
    operator_delete(rendered.m_pixels.m_ptr,local_448._M_allocated_capacity + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  if (local_398 != &local_388) {
    operator_delete(local_398,local_388 + 1);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8,local_3c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408,local_3f8[0] + 1);
  }
  if ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)uniforms.m_log != &uniforms.m_uniformLocations) {
    operator_delete(uniforms.m_log,uniforms.m_uniformLocations._M_t._M_impl._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&attrBindings[0].binding.type + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  uniforms.m_gl = (Functions *)(**(code **)(*(long *)this_01 + 0x18))(this_01);
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header;
  uniforms.m_programGL = local_118;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniforms.m_log = log;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(log,(ShaderProgram *)&src);
  if (local_f0 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_118);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"a_position","");
    rendered.m_width = 1;
    rendered.m_pixels.m_ptr = &local_448;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&rendered.m_pixels,__str._M_dataplus._M_p,
               __str._M_dataplus._M_p + __str._M_string_length);
    local_438 = 0;
    attrBindings[0].binding.type = rendered.m_width;
    paVar1 = &attrBindings[0].binding.name.field_2;
    attrBindings[0].binding.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&attrBindings[0].binding.name,rendered.m_pixels.m_ptr,
               rendered.m_pixels.m_cap + (long)rendered.m_pixels.m_ptr);
    attrBindings[0].binding.location = local_438;
    attrBindings[0].pointer.componentType = VTX_COMP_FLOAT;
    attrBindings[0].pointer.convert = VTX_COMP_CONVERT_NONE;
    attrBindings[0].pointer.numComponents = 3;
    attrBindings[0].pointer.numElements = 4;
    attrBindings[0].pointer.stride = 0;
    attrBindings[0].pointer.data = iterate::vertexPositions;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rendered.m_pixels.m_ptr != &local_448) {
      operator_delete(rendered.m_pixels.m_ptr,local_448._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glViewport(&glLog,local_484,local_488,0x20,0x20);
    rendered.m_width = 0;
    rendered.m_height = 6;
    rendered.m_pixels.m_ptr = (void *)CONCAT44(rendered.m_pixels.m_ptr._4_4_,1);
    rendered.m_pixels.m_cap = (size_t)iterate::indices;
    glu::draw((RenderContext *)this_01,local_118,1,attrBindings,(PrimitiveList *)&rendered,
              (DrawUtilCallback *)0x0);
    lVar8 = (**(code **)(*(long *)this_01 + 0x18))(this_01);
    dVar4 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar4,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0xc2b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)attrBindings[0].binding.name._M_dataplus._M_p != paVar1) {
      operator_delete(attrBindings[0].binding.name._M_dataplus._M_p,
                      attrBindings[0].binding.name.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&uniforms.m_uniformLocations._M_t);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&src);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if (local_f0 != false) {
    tcu::Surface::Surface(&rendered,0x20,0x20);
    attrBindings[0].binding.type = 8;
    attrBindings[0].binding._4_4_ = 3;
    data = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      data = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&src,(TextureFormat *)attrBindings,rendered.m_width,
               rendered.m_height,1,data);
    glu::readPixels((RenderContext *)this_01,local_484,local_488,(PixelBufferAccess *)&src);
    psVar2 = &attrBindings[0].binding.name._M_string_length;
    attrBindings[0].binding._0_8_ = psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)attrBindings,"Rendered","");
    uniforms.m_gl = (Functions *)&uniforms.m_programGL;
    std::__cxx11::string::_M_construct<char_const*>((string *)&uniforms,"Rendered image","");
    surface = &rendered;
    tcu::LogImage::LogImage
              ((LogImage *)&src,(string *)attrBindings,(string *)&uniforms,surface,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&src,(int)log,__buf,(size_t)surface);
    if (src.m_texBuffer.m_state != (SharedPtrStateBase *)&src.m_tex2D.m_state) {
      operator_delete(src.m_texBuffer.m_state,
                      (ulong)((long)&(src.m_tex2D.m_state)->_vptr_SharedPtrStateBase + 1));
    }
    if ((TextureFormat *)src._0_8_ != &src.m_format) {
      operator_delete((void *)src._0_8_,(long)src.m_format + 1);
    }
    if (uniforms.m_gl != (Functions *)&uniforms.m_programGL) {
      operator_delete(uniforms.m_gl,CONCAT44(uniforms._20_4_,uniforms.m_programGL) + 1);
    }
    if ((size_type *)attrBindings[0].binding._0_8_ != psVar2) {
      operator_delete((void *)attrBindings[0].binding._0_8_,
                      attrBindings[0].binding.name._M_string_length + 1);
    }
    tcu::Surface::~Surface(&rendered);
    lVar8 = (**(code **)(*(long *)this_01 + 0x20))(this_01);
    iVar14 = 1;
    if (1 < *(int *)(lVar8 + 0x20)) {
      iVar14 = *(int *)(lVar8 + 0x20);
    }
    bVar22 = (RVar3 != RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT & bVar22) == 0;
    src.m_size.m_data[1] = 0x1a0;
    if (bVar22) {
      src.m_size.m_data[1] = 0x400;
    }
    iVar18 = 0x260;
    if (bVar22) {
      iVar18 = 0x400;
    }
    src.m_size.m_data[2] = iVar18 * iVar14;
    uniforms.m_gl = (Functions *)0x2100000000;
    attrBindings[0].binding._0_8_ = &DAT_100000001;
    attrBindings[0].binding.name._M_dataplus._M_p._0_4_ = 1;
    src._0_8_ = &PTR_operator___0219ec40;
    bVar22 = readIntegerTextureViaFBOAndVerify
                       ((RenderContext *)this_01,&glLog,texture.super_ObjectWrapper.m_object,
                        TEXTURETYPE_2D,(TextureFormat *)&uniforms,(IVec3 *)attrBindings,
                        (ImageLayerVerifier *)&src);
    pcVar19 = "Got wrong value";
    if (bVar22) {
      pcVar19 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar22,pcVar19)
    ;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::reset(&testAttachment.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
         );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  ::reset(&colorAttachment.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
         );
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::reset(&fbo.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
         );
  glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

EarlyFragmentTestsCase::IterateResult EarlyFragmentTestsCase::iterate (void)
{
	const RenderContext&			renderCtx			= m_context.getRenderContext();
	TestLog&						log					(m_testCtx.getLog());
	glu::CallLogWrapper				glLog				(renderCtx.getFunctions(), log);
	de::Random						rnd					(deStringHash(getName()));
	const bool						expectPartialResult	= m_useEarlyTests && m_renderTarget != RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT;
	const int						viewportWidth		= RENDER_SIZE;
	const int						viewportHeight		= RENDER_SIZE;
	const int						viewportX			= (m_renderTarget == RENDERTARGET_DEFAULT) ? (rnd.getInt(0, renderCtx.getRenderTarget().getWidth() - viewportWidth))	: (0);
	const int						viewportY			= (m_renderTarget == RENDERTARGET_DEFAULT) ? (rnd.getInt(0, renderCtx.getRenderTarget().getHeight() - viewportHeight))	: (0);
	const glu::Texture				texture				(renderCtx);
	de::MovePtr<glu::Framebuffer>	fbo;
	de::MovePtr<glu::Renderbuffer>	colorAttachment;
	de::MovePtr<glu::Renderbuffer>	testAttachment;

	glLog.enableLogging(true);

	// Setup texture.

	log << TestLog::Message << "// Created a texture (name " << *texture << ")" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(GL_TEXTURE_2D, *texture);
	setTexParameteri(glLog, GL_TEXTURE_2D);
	{
		LayeredImage src(TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32), 1, 1, 1);
		src.setPixel(0, 0, 0, IVec4(0));
		uploadTexture(glLog, src, 0 /* always 2d texture, no buffer needed */);
	}
	glLog.glBindImageTexture(0, *texture, 0, GL_TRUE, 0, GL_READ_WRITE, GL_R32UI);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	// Set up framebuffer
	if (m_renderTarget == RENDERTARGET_FBO ||
		m_renderTarget == RENDERTARGET_FBO_WITHOUT_TEST_ATTACHMENT)
	{
		fbo				= de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(renderCtx));
		colorAttachment	= de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));
		testAttachment	= de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(renderCtx));

		glLog.glBindRenderbuffer(GL_RENDERBUFFER, **colorAttachment);
		glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, RENDER_SIZE, RENDER_SIZE);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen color attachment rb");

		glLog.glBindFramebuffer(GL_FRAMEBUFFER, **fbo);
		glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **colorAttachment);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo color attachment");

		if (m_renderTarget == RENDERTARGET_FBO && m_type == TESTTYPE_DEPTH)
		{
			glLog.glBindRenderbuffer(GL_RENDERBUFFER, **testAttachment);
			glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT16, RENDER_SIZE, RENDER_SIZE);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen depth attachment rb");

			glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, **testAttachment);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo depth attachment");
		}
		else if (m_renderTarget == RENDERTARGET_FBO && m_type == TESTTYPE_STENCIL)
		{
			glLog.glBindRenderbuffer(GL_RENDERBUFFER, **testAttachment);
			glLog.glRenderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, RENDER_SIZE, RENDER_SIZE);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "gen stencil attachment rb");

			glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, **testAttachment);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "set fbo stencil attachment");
		}

		glLog.glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **colorAttachment);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "setup fbo");
		TCU_CHECK(glLog.glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}

	// Set up appropriate conditions for the test.

	glLog.glClearColor(0.0f, 0.0f, 0.0f, 1.0f);
	glLog.glClear(GL_COLOR_BUFFER_BIT);

	if (m_type == TESTTYPE_DEPTH)
	{
		glLog.glClearDepthf(0.5f);
		glLog.glClear(GL_DEPTH_BUFFER_BIT);
		glLog.glEnable(GL_DEPTH_TEST);
	}
	else if (m_type == TESTTYPE_STENCIL)
	{
		glLog.glClearStencil(0);
		glLog.glClear(GL_STENCIL_BUFFER_BIT);
		glLog.glScissor(viewportX, viewportY, viewportWidth/2, viewportHeight);
		glLog.glEnable(GL_SCISSOR_TEST);
		glLog.glClearStencil(1);
		glLog.glClear(GL_STENCIL_BUFFER_BIT);
		glLog.glDisable(GL_SCISSOR_TEST);
		glLog.glStencilFunc(GL_EQUAL, 1, 1);
		glLog.glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
		glLog.glEnable(GL_STENCIL_TEST);
	}
	else
		DE_ASSERT(false);

	// Perform image stores in fragment shader.

	{
		const std::string glslVersionDeclaration = glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		// Generate fragment shader.

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::VertexSource(		glslVersionDeclaration + "\n"
															"\n"
															"highp in vec3 a_position;\n"
															"\n"
															"void main (void)\n"
															"{\n"
															"	gl_Position = vec4(a_position, 1.0);\n"
															"}\n")

								  << glu::FragmentSource(	glslVersionDeclaration + "\n"
															+ imageAtomicExtensionShaderRequires(renderCtx) +
															"\n"
															+ string(m_useEarlyTests ? "layout (early_fragment_tests) in;\n\n" : "") +
															"layout (location = 0) out highp vec4 o_color;\n"
															"\n"
															"precision highp uimage2D;\n"
															"\n"
															"layout (r32ui, binding=0) coherent uniform uimage2D u_image;\n"
															"\n"
															"void main (void)\n"
															"{\n"
															"	imageAtomicAdd(u_image, ivec2(0, 0), uint(1));\n"
															"	o_color = vec4(1.0);\n"
															"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and draw full-viewport quad.

		glLog.glUseProgram(program.getProgram());

		{
			static const float vertexPositions[4*3] =
			{
				-1.0, -1.0, -1.0f,
				 1.0, -1.0,  0.0f,
				-1.0,  1.0,  0.0f,
				 1.0,  1.0,  1.0f,
			};

			static const deUint16 indices[6] = { 0, 1, 2, 2, 1, 3 };

			const glu::VertexArrayBinding attrBindings[] =
			{
				glu::va::Float("a_position", 3, 4, 0, &vertexPositions[0])
			};

			glLog.glViewport(viewportX, viewportY, viewportWidth, viewportHeight);

			glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
				glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "Draw failed");
		}
	}

	// Log rendered result for convenience.
	{
		tcu::Surface rendered(viewportWidth, viewportHeight);
		glu::readPixels(renderCtx, viewportX, viewportY, rendered.getAccess());
		log << TestLog::Image("Rendered", "Rendered image", rendered);
	}

	// Read counter value and check.
	{
		const int numSamples		= de::max(1, renderCtx.getRenderTarget().getNumSamples());
		const int expectedCounter	= expectPartialResult ? viewportWidth*viewportHeight/2				: viewportWidth*viewportHeight;
		const int tolerance			= expectPartialResult ? de::max(viewportWidth, viewportHeight)*3	: 0;
		const int expectedMin		= de::max(0, expectedCounter - tolerance);
		const int expectedMax		= (expectedCounter + tolerance) * numSamples;

		if (readIntegerTextureViaFBOAndVerify(renderCtx, glLog, *texture, TEXTURETYPE_2D, TextureFormat(TextureFormat::R, TextureFormat::UNSIGNED_INT32),
											  IVec3(1, 1, 1), R32UIImageSingleValueVerifier(expectedMin, expectedMax)))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got wrong value");

		return STOP;
	}
}